

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

FileDescriptorProto * __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindExtension
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          string *containing_type,int field_number)

{
  second_type pFVar1;
  second_type *ppFVar2;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  first_type *in_stack_ffffffffffffffa0;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>_>
  *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [2];
  
  __x = local_40;
  std::make_pair<std::__cxx11::string_const&,int&>(__x,(int *)(in_RDI + 0x60));
  ppFVar2 = FindWithDefault<std::map<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>>
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(second_type *)__x);
  pFVar1 = *ppFVar2;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x5498e3);
  return pFVar1;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindExtension(
    const std::string& containing_type, int field_number) {
  return FindWithDefault(
      by_extension_, std::make_pair(containing_type, field_number), Value());
}